

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

int key_bytes_to_int(ion_byte_t *key,linear_hash_table_t *linear_hash)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  iVar2 = (linear_hash->super).record.key_size;
  iVar4 = 0;
  if (1 < iVar2) {
    uVar5 = 0;
    iVar4 = 0;
    iVar6 = 3;
    do {
      pbVar1 = key + uVar5;
      lVar3 = uVar5 + 1;
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + (key_bytes_to_int::coefficients[lVar3] - iVar6) * (uint)*pbVar1;
      iVar6 = key_bytes_to_int::coefficients[lVar3];
    } while (iVar2 - 1 != uVar5);
  }
  return iVar4;
}

Assistant:

int
key_bytes_to_int(
	ion_byte_t			*key,
	linear_hash_table_t *linear_hash
) {
	int			i;
	int			key_bytes_as_int	= 0;
	static int	coefficients[]		= { 3, 5, 7, 11, 13, 17, 19 };

	for (i = 0; i < linear_hash->super.record.key_size - 1; i++) {
		key_bytes_as_int += *(key + i) * coefficients[i + 1] - *(key + i) * coefficients[i];
	}

	return key_bytes_as_int;
}